

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

TextureMapping3DHandle
pbrt::TextureMapping3DHandle::Create
          (ParameterDictionary *parameters,Transform *renderFromTexture,FileLoc *loc,Allocator alloc
          )

{
  TransformMapping3D *in_RDI;
  TaggedPointer<pbrt::TransformMapping3D> this;
  Transform *in_stack_ffffffffffffff58;
  Transform *in_stack_ffffffffffffff60;
  
  this.bits = (uintptr_t)in_RDI;
  Inverse(in_stack_ffffffffffffff60);
  pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::TransformMapping3D,pbrt::Transform>
            ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
            );
  TaggedPointer<pbrt::TransformMapping3D>((TextureMapping3DHandle *)this.bits,in_RDI);
  return (TextureMapping3DHandle)(TaggedPointer<pbrt::TransformMapping3D>)this.bits;
}

Assistant:

TextureMapping3DHandle TextureMapping3DHandle::Create(
    const ParameterDictionary &parameters, const Transform &renderFromTexture,
    const FileLoc *loc, Allocator alloc) {
    return alloc.new_object<TransformMapping3D>(Inverse(renderFromTexture));
}